

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O2

void __thiscall QPDFParser::fixMissingKeys(QPDFParser *this)

{
  char cVar1;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  qpdf_offset_t offset;
  size_type sVar3;
  size_type sVar4;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *this_00;
  int __val;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string local_a0;
  string key;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &names._M_t._M_impl.super__Rb_tree_header._M_header;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (this->frame->olist).
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                (this->frame->olist).
                super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
                super__Vector_impl_data._M_start; p_Var5 != p_Var2; p_Var5 = p_Var5 + 1) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&key,p_Var5);
    cVar1 = key._M_dataplus._M_p[0x30];
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key._M_string_length);
    if (cVar1 == '\a') {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a0,p_Var5);
      QPDFObject::getStringValue_abi_cxx11_(&key,(QPDFObject *)local_a0._M_dataplus._M_p);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&names,&key);
      std::__cxx11::string::~string((string *)&key);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
    }
  }
  p_Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (this->frame->olist).
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  p_Var2 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
           (this->frame->olist).
           super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __val = 1;
LAB_001ae0db:
  if (p_Var5 == p_Var2) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&names._M_t);
    return;
  }
  do {
    std::__cxx11::to_string(&local_a0,__val);
    std::operator+(&key,"/QPDFFake",&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            ::count(&this->frame->dict,&key);
    if (sVar3 == 0) {
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&names,&key);
      if (sVar4 == 0) break;
    }
    std::__cxx11::string::~string((string *)&key);
    __val = __val + 1;
  } while( true );
  offset = this->frame->offset;
  std::operator+(&local_a0,"expected dictionary key but found non-name object; inserting key ",&key)
  ;
  warn(this,offset,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  this_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
            ::operator[](&this->frame->dict,&key);
  __val = __val + 1;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,p_Var5);
  std::__cxx11::string::~string((string *)&key);
  p_Var5 = p_Var5 + 1;
  goto LAB_001ae0db;
}

Assistant:

void
QPDFParser::fixMissingKeys()
{
    std::set<std::string> names;
    for (auto& obj: frame->olist) {
        if (obj.getObj()->getTypeCode() == ::ot_name) {
            names.insert(obj.getObj()->getStringValue());
        }
    }
    int next_fake_key = 1;
    for (auto const& item: frame->olist) {
        while (true) {
            const std::string key = "/QPDFFake" + std::to_string(next_fake_key++);
            const bool found_fake = frame->dict.count(key) == 0 && names.count(key) == 0;
            QTC::TC("qpdf", "QPDFParser found fake", (found_fake ? 0 : 1));
            if (found_fake) {
                warn(
                    frame->offset,
                    "expected dictionary key but found non-name object; inserting key " + key);
                frame->dict[key] = item;
                break;
            }
        }
    }
}